

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O2

void __thiscall piksel::Graphics::scale(Graphics *this,float x,float y)

{
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar1;
  vec<3,_float,_(glm::qualifier)0> *in_RCX;
  _Elt_pointer pSVar2;
  undefined1 local_5c [12];
  mat<4,_4,_float,_(glm::qualifier)0> local_50;
  
  psVar1 = this->stateStack;
  pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  local_5c._8_4_ = 1.0;
  local_5c._0_4_ = x;
  local_5c._4_4_ = y;
  glm::scale<float,(glm::qualifier)0>
            (&local_50,(glm *)&pSVar2[-1].shaderRelevantState.modelMatrix,
             (mat<4,_4,_float,_(glm::qualifier)0> *)local_5c,in_RCX);
  *(undefined8 *)&pSVar2[-1].shaderRelevantState.modelMatrix.value[3].field_0 =
       local_50.value[3].field_0._0_8_;
  *(undefined8 *)((long)&pSVar2[-1].shaderRelevantState.modelMatrix.value[3].field_0 + 8) =
       local_50.value[3].field_0._8_8_;
  *(undefined8 *)&pSVar2[-1].shaderRelevantState.modelMatrix.value[2].field_0 =
       local_50.value[2].field_0._0_8_;
  *(undefined8 *)((long)&pSVar2[-1].shaderRelevantState.modelMatrix.value[2].field_0 + 8) =
       local_50.value[2].field_0._8_8_;
  *(undefined8 *)&pSVar2[-1].shaderRelevantState.modelMatrix.value[1].field_0 =
       local_50.value[1].field_0._0_8_;
  *(undefined8 *)((long)&pSVar2[-1].shaderRelevantState.modelMatrix.value[1].field_0 + 8) =
       local_50.value[1].field_0._8_8_;
  *(undefined8 *)&pSVar2[-1].shaderRelevantState.modelMatrix.value[0].field_0 =
       local_50.value[0].field_0._0_8_;
  *(undefined8 *)((long)&pSVar2[-1].shaderRelevantState.modelMatrix.value[0].field_0 + 8) =
       local_50.value[0].field_0._8_8_;
  return;
}

Assistant:

State& Graphics::peek() {
    return stateStack.top();
}